

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh.cxx
# Opt level: O0

void __thiscall xray_re::xr_mesh::load(xr_mesh *this,xr_reader *r,xr_object *object)

{
  uint uVar1;
  xr_object *pxVar2;
  bool bVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  size_t sVar6;
  size_type sVar7;
  pointer plVar8;
  __normal_iterator<xray_re::lw_face_*,_std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>_>
  local_50;
  __normal_iterator<xray_re::lw_face_*,_std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>_>
  local_48;
  lw_face_vec_it it;
  read_surfmap local_38;
  unsigned_short local_2a;
  size_t sStack_28;
  uint16_t version;
  size_t size;
  xr_object *object_local;
  xr_reader *r_local;
  xr_mesh *this_local;
  
  size = (size_t)object;
  object_local = (xr_object *)r;
  r_local = (xr_reader *)this;
  sVar6 = xr_reader::r_chunk<unsigned_short>(r,0x1000,&local_2a);
  if (sVar6 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0xe6,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  if (local_2a != 0x11) {
    __assert_fail("version == EMESH_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0xe7,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  sVar6 = xr_reader::r_chunk<std::__cxx11::string>((xr_reader *)object_local,0x1001,&this->m_name);
  if (sVar6 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0xea,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  xr_reader::debug_find_chunk((xr_reader *)object_local);
  sVar6 = xr_reader::r_chunk<xray_re::_aabb<float>>((xr_reader *)object_local,0x1004,&this->m_bbox);
  if (sVar6 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0xee,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  sVar6 = xr_reader::r_chunk<unsigned_char>((xr_reader *)object_local,0x1002,&this->m_flags);
  if (sVar6 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0xf1,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  xr_reader::r_chunk<xray_re::lw_options>((xr_reader *)object_local,0x1010,&this->m_options);
  sVar6 = xr_reader::find_chunk((xr_reader *)object_local,0x1005);
  pxVar2 = object_local;
  if (sVar6 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0x10a,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  uVar5 = xr_reader::r_u32((xr_reader *)object_local);
  xr_reader::r_seq<std::vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>>>
            ((xr_reader *)pxVar2,(ulong)uVar5,&this->m_points);
  sVar6 = xr_reader::find_chunk((xr_reader *)object_local,0x1006);
  pxVar2 = object_local;
  if (sVar6 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0x110,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  uVar5 = xr_reader::r_u32((xr_reader *)object_local);
  xr_reader::r_seq<std::vector<xray_re::lw_face,std::allocator<xray_re::lw_face>>,read_face>
            ((xr_reader *)pxVar2,uVar5,&this->m_faces);
  xr_reader::debug_find_chunk((xr_reader *)object_local);
  sVar6 = xr_reader::find_chunk((xr_reader *)object_local,0x1013);
  sStack_28 = sVar6;
  if (sVar6 != 0) {
    sVar7 = std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>::size(&this->m_faces);
    pxVar2 = object_local;
    if (sVar6 != sVar7 << 2) {
      __assert_fail("size == m_faces.size()*sizeof(uint32_t)",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                    ,0x115,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
    }
    sVar7 = std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>::size(&this->m_faces);
    xr_reader::r_seq<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              ((xr_reader *)pxVar2,sVar7,&this->m_sgroups);
    xr_reader::debug_find_chunk((xr_reader *)object_local);
  }
  sVar6 = xr_reader::find_chunk((xr_reader *)object_local,0x1008);
  pxVar2 = object_local;
  if (sVar6 != 0) {
    uVar5 = xr_reader::r_u32((xr_reader *)object_local);
    xr_reader::
    r_seq<std::vector<xray_re::_svector<xray_re::lw_vmref_entry,5u>,std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,5u>>>,read_vmref>
              ((xr_reader *)pxVar2,uVar5,&this->m_vmrefs);
    xr_reader::debug_find_chunk((xr_reader *)object_local);
    sVar6 = xr_reader::find_chunk((xr_reader *)object_local,0x1009);
    pxVar2 = object_local;
    if (sVar6 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                    ,0x120,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
    }
    uVar4 = xr_reader::r_u16((xr_reader *)object_local);
    read_surfmap::read_surfmap(&local_38,(xr_object *)size);
    xr_reader::
    r_seq<std::vector<xray_re::xr_surfmap*,std::allocator<xray_re::xr_surfmap*>>,read_surfmap>
              ((xr_reader *)pxVar2,(ulong)uVar4,&this->m_surfmaps,local_38);
    xr_reader::debug_find_chunk((xr_reader *)object_local);
    sVar6 = xr_reader::find_chunk((xr_reader *)object_local,0x1012);
    pxVar2 = object_local;
    if (sVar6 == 0) {
      sVar6 = xr_reader::find_chunk((xr_reader *)object_local,0x1011);
      pxVar2 = object_local;
      if (sVar6 == 0) {
        sVar6 = xr_reader::find_chunk((xr_reader *)object_local,0x1007);
        pxVar2 = object_local;
        if (sVar6 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                        ,299,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
        }
        uVar5 = xr_reader::r_u32((xr_reader *)object_local);
        xr_reader::
        r_seq<std::vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>>,xray_re::xr_vmap::f_read_0>
                  ((xr_reader *)pxVar2,uVar5,&this->m_vmaps);
      }
      else {
        uVar5 = xr_reader::r_u32((xr_reader *)object_local);
        xr_reader::
        r_seq<std::vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>>,xray_re::xr_vmap::f_read_1>
                  ((xr_reader *)pxVar2,uVar5,&this->m_vmaps);
      }
    }
    else {
      uVar5 = xr_reader::r_u32((xr_reader *)object_local);
      xr_reader::
      r_seq<std::vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>>,xray_re::xr_vmap::f_read_2>
                ((xr_reader *)pxVar2,uVar5,&this->m_vmaps);
    }
    xr_reader::debug_find_chunk((xr_reader *)object_local);
    local_48._M_current =
         (lw_face *)
         std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>::begin(&this->m_faces);
    while( true ) {
      local_50._M_current =
           (lw_face *)
           std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>::end(&this->m_faces);
      bVar3 = __gnu_cxx::operator!=(&local_48,&local_50);
      if (!bVar3) {
        return;
      }
      plVar8 = __gnu_cxx::
               __normal_iterator<xray_re::lw_face_*,_std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>_>
               ::operator->(&local_48);
      uVar1 = (plVar8->field_0).field_0.v[0];
      sVar7 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::
              size(&this->m_points);
      if (sVar7 <= uVar1) {
        __assert_fail("it->v0 < m_points.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                      ,0x130,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
      }
      plVar8 = __gnu_cxx::
               __normal_iterator<xray_re::lw_face_*,_std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>_>
               ::operator->(&local_48);
      uVar1 = (plVar8->field_0).field_0.v[1];
      sVar7 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::
              size(&this->m_points);
      if (sVar7 <= uVar1) {
        __assert_fail("it->v1 < m_points.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                      ,0x131,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
      }
      plVar8 = __gnu_cxx::
               __normal_iterator<xray_re::lw_face_*,_std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>_>
               ::operator->(&local_48);
      uVar1 = (plVar8->field_0).field_0.v[2];
      sVar7 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::
              size(&this->m_points);
      if (sVar7 <= uVar1) break;
      plVar8 = __gnu_cxx::
               __normal_iterator<xray_re::lw_face_*,_std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>_>
               ::operator->(&local_48);
      uVar1 = (plVar8->field_0).field_0.ref[0];
      sVar7 = std::
              vector<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
              ::size(&this->m_vmrefs);
      if (sVar7 <= uVar1) {
        __assert_fail("it->ref0 < m_vmrefs.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                      ,0x133,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
      }
      plVar8 = __gnu_cxx::
               __normal_iterator<xray_re::lw_face_*,_std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>_>
               ::operator->(&local_48);
      uVar1 = (plVar8->field_0).field_0.ref[1];
      sVar7 = std::
              vector<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
              ::size(&this->m_vmrefs);
      if (sVar7 <= uVar1) {
        __assert_fail("it->ref1 < m_vmrefs.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                      ,0x134,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
      }
      plVar8 = __gnu_cxx::
               __normal_iterator<xray_re::lw_face_*,_std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>_>
               ::operator->(&local_48);
      uVar1 = (plVar8->field_0).field_0.ref[2];
      sVar7 = std::
              vector<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
              ::size(&this->m_vmrefs);
      if (sVar7 <= uVar1) {
        __assert_fail("it->ref2 < m_vmrefs.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                      ,0x135,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
      }
      __gnu_cxx::
      __normal_iterator<xray_re::lw_face_*,_std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>_>
      ::operator++(&local_48);
    }
    __assert_fail("it->v2 < m_points.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0x132,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                ,0x11b,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
}

Assistant:

void xr_mesh::load(xr_reader& r, xr_object& object)
{
	size_t size;

	uint16_t version;
	if (!r.r_chunk<uint16_t>(EMESH_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == EMESH_VERSION);

	if (!r.r_chunk(EMESH_CHUNK_MESHNAME, m_name))
		xr_not_expected();
	r.debug_find_chunk();

	if (!r.r_chunk<fbox>(EMESH_CHUNK_BBOX, m_bbox))
		xr_not_expected();

	if (!r.r_chunk<uint8_t>(EMESH_CHUNK_FLAGS, m_flags))
		xr_not_expected();

	r.r_chunk<lw_options>(EMESH_CHUNK_OPTIONS, m_options);

#if 0
	if (!(size = r.find_chunk(EMESH_CHUNK_VERTS)))
		xr_not_expected();
	r.r_seq(r.r_u32(), m_points);
//	if (m_flags & EMF_3DSMAX) {
//		xr_assert(m_points.size()*sizeof(fvector3) < size);
	if (m_points.size()*sizeof(fvector3) < size) {
		m_adj_counts.reserve(m_points.size());
		m_adj_refs.reserve(m_points.size());
		while (size) {
			uint8_t n = r.r_u8();
			m_adj_counts.push_back(n);
			xr_assert(size >= n*sizeof(uint32_t) + sizeof(uint8_t));
			size -= n*sizeof(uint32_t) + sizeof(uint8_t)
			while (n--)
				m_adj_refs.push_back(r.r_u32());
		}
	}
	r.debug_find_chunk();
#else
	if (!r.find_chunk(EMESH_CHUNK_VERTS))
		xr_not_expected();
	r.r_seq(r.r_u32(), m_points);
	// adjacency data is ignored by AE/xrECoreB.dll as well
#endif

	if (!r.find_chunk(EMESH_CHUNK_FACES))
		xr_not_expected();
	r.r_seq(r.r_u32(), m_faces, read_face());
	r.debug_find_chunk();

	if ((size = r.find_chunk(EMESH_CHUNK_SG))) {
		xr_assert(size == m_faces.size()*sizeof(uint32_t));
		r.r_seq(m_faces.size(), m_sgroups);
		r.debug_find_chunk();
	}

	if (!r.find_chunk(EMESH_CHUNK_VMREFS))
		xr_not_expected();
	r.r_seq(r.r_u32(), m_vmrefs, read_vmref());
	r.debug_find_chunk();

	if (!r.find_chunk(EMESH_CHUNK_SFACE))
		xr_not_expected();
	r.r_seq(r.r_u16(), m_surfmaps, read_surfmap(object));
	r.debug_find_chunk();

	if (r.find_chunk(EMESH_CHUNK_VMAPS_2)) {
		r.r_seq(r.r_u32(), m_vmaps, xr_vmap::f_read_2());
	} else if (r.find_chunk(EMESH_CHUNK_VMAPS_1)) {
		r.r_seq(r.r_u32(), m_vmaps, xr_vmap::f_read_1());
	} else if (r.find_chunk(EMESH_CHUNK_VMAPS_0)) {
		r.r_seq(r.r_u32(), m_vmaps, xr_vmap::f_read_0());
	} else {
		xr_not_expected();
	}
	r.debug_find_chunk();
#if 1
	for (lw_face_vec_it it = m_faces.begin(); it != m_faces.end(); ++it) {
		xr_assert(it->v0 < m_points.size());
		xr_assert(it->v1 < m_points.size());
		xr_assert(it->v2 < m_points.size());
		xr_assert(it->ref0 < m_vmrefs.size());
		xr_assert(it->ref1 < m_vmrefs.size());
		xr_assert(it->ref2 < m_vmrefs.size());
	}
#endif
}